

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

int big_block_get_attr(BigBlock *block,char *attrname,void *data,char *dtype,int nmemb)

{
  int iVar1;
  int *piVar2;
  char *msg;
  undefined8 local_38;
  undefined8 uStack_30;
  char *local_28;
  undefined8 uStack_20;
  
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = attrname;
  piVar2 = (int *)bsearch(&local_38,block->attrset->attrlist,block->attrset->listused,0x20,attr_cmp)
  ;
  if (piVar2 == (int *)0x0) {
    msg = "attr not found";
    iVar1 = 0x6de;
  }
  else {
    if (*piVar2 == nmemb) {
      iVar1 = dtype_convert_simple
                        (data,dtype,*(void **)(piVar2 + 6),(char *)(piVar2 + 1),(long)nmemb);
      return iVar1;
    }
    msg = "attr nmemb mismatch";
    iVar1 = 0x6df;
  }
  _big_file_raise(msg,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                  ,iVar1);
  return -1;
}

Assistant:

int
big_block_get_attr(BigBlock * block, const char * attrname, void * data, const char * dtype, int nmemb)
{
    return attrset_get_attr(block->attrset, attrname, data, dtype, nmemb);
}